

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O3

void installCopier_c(char *typeName,MockTypeCopyFunction_c copier)

{
  MockSupport *pMVar1;
  MockCFunctionCopierNode *pMVar2;
  SimpleString SStack_28;
  
  pMVar2 = (MockCFunctionCopierNode *)
           operator_new(0x18,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockSupport_c.cpp"
                        ,0xe4);
  (pMVar2->super_MockNamedValueCopier)._vptr_MockNamedValueCopier =
       (_func_int **)&PTR__MockNamedValueCopier_002e7180;
  pMVar2->next_ = copierList_;
  pMVar2->copier_ = copier;
  pMVar1 = currentMockSupport;
  copierList_ = pMVar2;
  SimpleString::SimpleString(&SStack_28,typeName);
  (*pMVar1->_vptr_MockSupport[0x2d])(pMVar1,&SStack_28,copierList_);
  SimpleString::~SimpleString(&SStack_28);
  return;
}

Assistant:

static void installCopier_c (const char* typeName, MockTypeCopyFunction_c copier)
{
    copierList_ = new MockCFunctionCopierNode(copierList_, copier);
    currentMockSupport->installCopier(typeName, *copierList_);
}